

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O1

void bitmap_copy(bitmap_t dst,const_bitmap_t src)

{
  byte bVar1;
  bitmap_el_t *pbVar2;
  bitmap_el_t *pbVar3;
  ulong uVar4;
  bitmap_t pVVar5;
  MIR_context_t ctx;
  int iVar6;
  undefined8 extraout_RAX;
  bitmap_t pVVar7;
  bitmap_t pVVar8;
  ulong *extraout_RDX;
  const_bitmap_t extraout_RDX_00;
  bitmap_t pVVar9;
  const_bitmap_t extraout_RDX_01;
  char *pcVar10;
  bitmap_t pVVar11;
  bitmap_t bm;
  bitmap_t unaff_RBP;
  bitmap_t pVVar12;
  const_bitmap_t nb;
  const_bitmap_t src_00;
  const_bitmap_t nb_00;
  const_bitmap_t nb_01;
  char *pcVar13;
  bitmap_el_t bVar14;
  size_t sVar15;
  bitmap_t unaff_R12;
  bitmap_t unaff_R13;
  ulong uVar16;
  const_bitmap_t pVVar17;
  long *plVar18;
  ulong uVar19;
  const_bitmap_t pVVar20;
  undefined8 uVar21;
  
  if (dst == (bitmap_t)0x0) {
    bitmap_copy_cold_3();
LAB_00167a17:
    bitmap_copy_cold_2();
  }
  else {
    if (src == (const_bitmap_t)0x0) goto LAB_00167a17;
    uVar19 = src->els_num;
    if (dst->els_num < uVar19) {
      bitmap_expand(dst,uVar19 << 6);
LAB_001679f9:
      memcpy(dst->varr,src->varr,uVar19 << 3);
      return;
    }
    if (dst->varr != (bitmap_el_t *)0x0) {
      dst->els_num = uVar19;
      goto LAB_001679f9;
    }
  }
  bitmap_copy_cold_1();
  pVVar9 = dst;
  if (src == (const_bitmap_t)0x0) {
LAB_00167ad5:
    bitmap_and_cold_4();
    nb = src;
LAB_00167ada:
    bitmap_and_cold_3();
  }
  else {
    nb = src;
    if (extraout_RDX == (ulong *)0x0) goto LAB_00167ada;
    unaff_R12 = (bitmap_t)src->els_num;
    unaff_R13 = (bitmap_t)*extraout_RDX;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    nb = (const_bitmap_t)((long)unaff_RBP << 6);
    bitmap_expand(dst,(size_t)nb);
    if (dst != (bitmap_t)0x0) {
      pbVar2 = dst->varr;
      if (unaff_RBP == (bitmap_t)0x0) {
        pVVar7 = (bitmap_t)0x0;
        src = nb;
      }
      else {
        pbVar3 = src->varr;
        src = (const_bitmap_t)extraout_RDX[2];
        pVVar9 = (bitmap_t)0x0;
        pVVar7 = (bitmap_t)0x0;
        do {
          if (pVVar9 < unaff_R12) {
            bVar14 = pbVar3[(long)pVVar9];
          }
          else {
            bVar14 = 0;
          }
          if (pVVar9 < unaff_R13) {
            sVar15 = (&src->els_num)[(long)pVVar9];
          }
          else {
            sVar15 = 0;
          }
          pbVar2[(long)pVVar9] = sVar15 & bVar14;
          pVVar9 = (bitmap_t)((long)&pVVar9->els_num + 1);
          if ((sVar15 & bVar14) != 0) {
            pVVar7 = pVVar9;
          }
        } while (unaff_RBP != pVVar9);
      }
      if ((pbVar2 != (bitmap_el_t *)0x0) && (pVVar7 <= (bitmap_t)dst->els_num)) {
        dst->els_num = (size_t)pVVar7;
        return;
      }
      bitmap_and_cold_1();
      goto LAB_00167ad5;
    }
  }
  bitmap_and_cold_2();
  pbVar2 = pVVar9[5].varr;
  if ((pbVar2 != (bitmap_el_t *)0x0) && (pbVar2[2] != 0)) {
    *pbVar2 = 0;
    return;
  }
  dom_con_func_0_cold_1();
  pVVar9 = (bitmap_t)pVVar9[3].size;
  bitmap_copy(pVVar9,(const_bitmap_t)nb[5].varr);
  plVar18 = (long *)nb[2].els_num;
  pVVar7 = (bitmap_t)nb[5].varr;
  src_00 = *(const_bitmap_t *)(*plVar18 + 0x90);
  bitmap_copy(pVVar7,src_00);
  while (plVar18 = (long *)plVar18[3], plVar18 != (long *)0x0) {
    src_00 = (const_bitmap_t)nb[5].varr;
    pVVar7 = src_00;
    bitmap_and(src_00,src_00,*(bitmap_t *)(*plVar18 + 0x90));
  }
  pVVar11 = (bitmap_t)nb[5].varr;
  if (pVVar11 == (bitmap_t)0x0) {
    dom_con_func_n_cold_2();
  }
  else if (pVVar9 != (bitmap_t)0x0) {
    uVar19 = pVVar11->els_num;
    uVar4 = pVVar9->els_num;
    pVVar7 = pVVar9;
    uVar16 = uVar4;
    if (uVar4 < uVar19) {
      pVVar7 = pVVar11;
      pVVar11 = pVVar9;
      uVar16 = uVar19;
      uVar19 = uVar4;
    }
    pbVar2 = pVVar7->varr;
    iVar6 = bcmp(pVVar11->varr,pbVar2,uVar19 * 8);
    if ((iVar6 == 0) && (uVar19 < uVar16)) {
      do {
        if (pbVar2[uVar19] != 0) {
          return;
        }
        uVar19 = uVar19 + 1;
      } while (uVar16 != uVar19);
    }
    return;
  }
  dom_con_func_n_cold_1();
  pVVar11 = (bitmap_t)pVVar7[3].size;
  if ((pVVar11 != (bitmap_t)0x0) && (pVVar11->varr != (bitmap_el_t *)0x0)) {
    pVVar11->els_num = 0;
    uVar19 = src_00->els_num;
    bitmap_expand(pVVar11,uVar19 + 1);
    pVVar11->varr[uVar19 >> 6] = pVVar11->varr[uVar19 >> 6] | 1L << (uVar19 & 0x3f);
    bitmap_ior((bitmap_t)src_00[6].els_num,(bitmap_t)src_00[5].varr,(bitmap_t)pVVar7[3].size);
    return;
  }
  dom_trans_func_cold_1();
  nb_00 = src_00;
  bm = pVVar7;
  if (src_00 == (const_bitmap_t)0x0) {
LAB_00167d17:
    bitmap_ior_cold_4();
LAB_00167d1c:
    src_00 = pVVar11;
    pVVar7 = pVVar9;
    bitmap_ior_cold_3();
  }
  else {
    nb = extraout_RDX_00;
    if (extraout_RDX_00 == (const_bitmap_t)0x0) goto LAB_00167d1c;
    unaff_R12 = (bitmap_t)src_00->els_num;
    unaff_R13 = (bitmap_t)extraout_RDX_00->els_num;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    nb_00 = (const_bitmap_t)((long)unaff_RBP << 6);
    bitmap_expand(pVVar7,(size_t)nb_00);
    if (pVVar7 != (bitmap_t)0x0) {
      pbVar2 = pVVar7->varr;
      if (unaff_RBP == (bitmap_t)0x0) {
        pVVar9 = (bitmap_t)0x0;
      }
      else {
        nb_00 = (const_bitmap_t)src_00->varr;
        bm = (bitmap_t)extraout_RDX_00->varr;
        pVVar11 = (bitmap_t)0x0;
        pVVar9 = (bitmap_t)0x0;
        do {
          if (pVVar11 < unaff_R12) {
            sVar15 = (&nb_00->els_num)[(long)pVVar11];
          }
          else {
            sVar15 = 0;
          }
          if (pVVar11 < unaff_R13) {
            bVar14 = (&bm->els_num)[(long)pVVar11];
          }
          else {
            bVar14 = 0;
          }
          nb = (const_bitmap_t)pbVar2[(long)pVVar11];
          pbVar2[(long)pVVar11] = bVar14 | sVar15;
          pVVar11 = (bitmap_t)((long)&pVVar11->els_num + 1);
          if ((bVar14 | sVar15) != 0) {
            pVVar9 = pVVar11;
          }
        } while (unaff_RBP != pVVar11);
      }
      if ((pbVar2 != (bitmap_el_t *)0x0) && (pVVar9 <= (bitmap_t)pVVar7->els_num)) {
        pVVar7->els_num = (size_t)pVVar9;
        return;
      }
      bitmap_ior_cold_1();
      pVVar9 = pVVar7;
      pVVar11 = src_00;
      goto LAB_00167d17;
    }
  }
  bitmap_ior_cold_2();
  pVVar11 = pVVar7;
  nb_01 = nb_00;
  pVVar9 = bm;
  pVVar17 = nb;
  pVVar20 = src_00;
  uVar21 = extraout_RAX;
  if (nb_00 == (const_bitmap_t)0x0) {
LAB_00167ddf:
    bitmap_and_compl_cold_4();
  }
  else {
    pVVar17 = extraout_RDX_01;
    if (extraout_RDX_01 != (const_bitmap_t)0x0) {
      pVVar11 = (bitmap_t)nb_00->els_num;
      pVVar5 = (bitmap_t)extraout_RDX_01->els_num;
      pVVar12 = pVVar5;
      if (pVVar5 < pVVar11) {
        pVVar12 = pVVar11;
      }
      nb_01 = (const_bitmap_t)((long)pVVar12 << 6);
      bitmap_expand(bm,(size_t)nb_01);
      if (bm == (bitmap_t)0x0) goto LAB_00167de9;
      pbVar2 = bm->varr;
      if (pVVar12 == (bitmap_t)0x0) {
        pVVar8 = (bitmap_t)0x0;
      }
      else {
        pbVar3 = nb_00->varr;
        nb_01 = (const_bitmap_t)extraout_RDX_01->varr;
        pVVar9 = (bitmap_t)0x0;
        pVVar8 = (bitmap_t)0x0;
        do {
          if (pVVar9 < pVVar11) {
            bVar14 = pbVar3[(long)pVVar9];
          }
          else {
            bVar14 = 0;
          }
          uVar19 = 0xffffffffffffffff;
          if (pVVar9 < pVVar5) {
            uVar19 = ~(&nb_01->els_num)[(long)pVVar9];
          }
          pbVar2[(long)pVVar9] = uVar19 & bVar14;
          pVVar9 = (bitmap_t)((long)&pVVar9->els_num + 1);
          if ((uVar19 & bVar14) != 0) {
            pVVar8 = pVVar9;
          }
        } while (pVVar12 != pVVar9);
      }
      if ((pbVar2 != (bitmap_el_t *)0x0) && (pVVar8 <= (bitmap_t)bm->els_num)) {
        bm->els_num = (size_t)pVVar8;
        return;
      }
      bitmap_and_compl_cold_1();
      pVVar11 = bm;
      pVVar20 = nb_00;
      goto LAB_00167ddf;
    }
  }
  nb_00 = pVVar20;
  bm = pVVar11;
  bitmap_and_compl_cold_3();
LAB_00167de9:
  bitmap_and_compl_cold_2();
  if (((FILE *)pVVar9[1].els_num != (FILE *)0x0) && (1 < (int)pVVar9[1].size)) {
    ctx = (MIR_context_t)pVVar9->els_num;
    bVar1 = *(byte *)((long)&nb_01->size + 1);
    pcVar13 = "may/must alloca ";
    if ((bVar1 & 3) == 0) {
      pcVar13 = "must alloca";
    }
    pcVar10 = "";
    if (bVar1 != 0) {
      pcVar10 = pcVar13;
    }
    pcVar13 = "const val";
    if ((char)nb_01->size == '\0') {
      pcVar13 = "val";
    }
    fprintf((FILE *)pVVar9[1].els_num,"%s%s=%lld for insn %lu:",pcVar10,pcVar13,nb_01[1].els_num,
            (ulong)*(uint *)((long)&nb_01->size + 4),bm,pVVar17,nb_00,uVar21,pVVar7,unaff_R12,
            unaff_R13,nb,src_00,unaff_RBP);
    MIR_output_insn(ctx,(FILE *)pVVar9[1].els_num,(MIR_insn_t_conflict)nb_01->els_num,
                    (MIR_func_t)pVVar9->varr[8],1);
    return;
  }
  return;
}

Assistant:

static inline void bitmap_copy (bitmap_t dst, const_bitmap_t src) {
  size_t dst_len = VARR_LENGTH (bitmap_el_t, dst);
  size_t src_len = VARR_LENGTH (bitmap_el_t, src);

  if (dst_len >= src_len)
    VARR_TRUNC (bitmap_el_t, dst, src_len);
  else
    bitmap_expand (dst, src_len * BITMAP_WORD_BITS);
  memcpy (VARR_ADDR (bitmap_el_t, dst), VARR_ADDR (bitmap_el_t, src),
          src_len * sizeof (bitmap_el_t));
}